

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ImplicationConstraint * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ImplicationConstraint,slang::ast::Expression_const&,slang::ast::Constraint_const&>
          (BumpAllocator *this,Expression *args,Constraint *args_1)

{
  ImplicationConstraint *this_00;
  Constraint *args_local_1;
  Expression *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ImplicationConstraint *)allocate(this,0x20,8);
  ast::ImplicationConstraint::ImplicationConstraint(this_00,args,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }